

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_handle_eod_pdu(rtr_socket *rtr_socket,pdu_end_of_data_v0 *eod_pdu,char *pdu_data)

{
  int iVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  int interv_retval;
  char *pdu_data_local;
  pdu_end_of_data_v0 *eod_pdu_local;
  rtr_socket *rtr_socket_local;
  char local_58 [8];
  char txt [67];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  if ((uint)eod_pdu->session_id != rtr_socket->session_id) {
    snprintf(local_58,0x43,"Expected session_id: %u, received session_id. %u in EOD PDU",
             (ulong)rtr_socket->session_id,(ulong)eod_pdu->session_id);
    sVar2 = strlen(local_58);
    rtr_send_error_pdu_from_host(rtr_socket,pdu_data,0xffff,CORRUPT_DATA,local_58,(int)sVar2 + 1);
    rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
    rtr_socket_local._4_4_ = -1;
    goto LAB_0010f231;
  }
  if (((eod_pdu->ver == '\x01') || (eod_pdu->ver == '\x02')) &&
     (rtr_socket->iv_mode != RTR_INTERVAL_MODE_IGNORE_ANY)) {
    iVar1 = rtr_check_interval_option
                      (rtr_socket,rtr_socket->iv_mode,*(uint32_t *)(pdu_data + 0x14),
                       RTR_INTERVAL_TYPE_EXPIRATION);
    if (iVar1 == -1) {
      interval_send_error_pdu(rtr_socket,pdu_data,*(uint32_t *)(pdu_data + 0x14),600,0x2a300);
      rtr_socket_local._4_4_ = -1;
      goto LAB_0010f231;
    }
    iVar1 = rtr_check_interval_option
                      (rtr_socket,rtr_socket->iv_mode,*(uint32_t *)(pdu_data + 0xc),
                       RTR_INTERVAL_TYPE_REFRESH);
    if (iVar1 == -1) {
      interval_send_error_pdu(rtr_socket,pdu_data,*(uint32_t *)(pdu_data + 0xc),1,0x15180);
      rtr_socket_local._4_4_ = -1;
      goto LAB_0010f231;
    }
    iVar1 = rtr_check_interval_option
                      (rtr_socket,rtr_socket->iv_mode,*(uint32_t *)(pdu_data + 0x10),
                       RTR_INTERVAL_TYPE_RETRY);
    if (iVar1 == -1) {
      interval_send_error_pdu(rtr_socket,pdu_data,*(uint32_t *)(pdu_data + 0x10),1,0x1c20);
      rtr_socket_local._4_4_ = -1;
      goto LAB_0010f231;
    }
    lrtr_dbg("RTR Socket: New interval values: expire_interval:%u, refresh_interval:%u, retry_interval:%u"
             ,(ulong)rtr_socket->expire_interval,(ulong)rtr_socket->refresh_interval,
             (ulong)rtr_socket->retry_interval);
  }
  rtr_socket_local._4_4_ = 0;
LAB_0010f231:
  if (*(long *)(in_FS_OFFSET + 0x28) == stack0xfffffffffffffff0) {
    return rtr_socket_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

static inline int rtr_handle_eod_pdu(struct rtr_socket *rtr_socket, struct pdu_end_of_data_v0 *eod_pdu, char pdu_data[])
{
	if (eod_pdu->session_id != rtr_socket->session_id) {
		char txt[67];

		snprintf(txt, sizeof(txt), "Expected session_id: %u, received session_id. %u in EOD PDU",
			 rtr_socket->session_id, eod_pdu->session_id);
		rtr_send_error_pdu_from_host(rtr_socket, pdu_data, RTR_MAX_PDU_LEN, CORRUPT_DATA, txt, strlen(txt) + 1);
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		return RTR_ERROR;
	}

	if ((eod_pdu->ver == RTR_PROTOCOL_VERSION_1 || eod_pdu->ver == RTR_PROTOCOL_VERSION_2) &&
	    rtr_socket->iv_mode != RTR_INTERVAL_MODE_IGNORE_ANY) {
		int interv_retval;

		interv_retval = rtr_check_interval_option(rtr_socket, rtr_socket->iv_mode,
							  ((struct pdu_end_of_data_v1_v2 *)pdu_data)->expire_interval,
							  RTR_INTERVAL_TYPE_EXPIRATION);

		if (interv_retval == RTR_ERROR) {
			interval_send_error_pdu(rtr_socket, pdu_data,
						((struct pdu_end_of_data_v1_v2 *)pdu_data)->expire_interval,
						RTR_EXPIRATION_MIN, RTR_EXPIRATION_MAX);
			return RTR_ERROR;
		}

		interv_retval = rtr_check_interval_option(rtr_socket, rtr_socket->iv_mode,
							  ((struct pdu_end_of_data_v1_v2 *)pdu_data)->refresh_interval,
							  RTR_INTERVAL_TYPE_REFRESH);

		if (interv_retval == RTR_ERROR) {
			interval_send_error_pdu(rtr_socket, pdu_data,
						((struct pdu_end_of_data_v1_v2 *)pdu_data)->refresh_interval,
						RTR_REFRESH_MIN, RTR_REFRESH_MAX);
			return RTR_ERROR;
		}

		interv_retval = rtr_check_interval_option(rtr_socket, rtr_socket->iv_mode,
							  ((struct pdu_end_of_data_v1_v2 *)pdu_data)->retry_interval,
							  RTR_INTERVAL_TYPE_RETRY);

		if (interv_retval == RTR_ERROR) {
			interval_send_error_pdu(rtr_socket, pdu_data,
						((struct pdu_end_of_data_v1_v2 *)pdu_data)->retry_interval,
						RTR_RETRY_MIN, RTR_RETRY_MAX);
			return RTR_ERROR;
		}

		RTR_DBG("New interval values: expire_interval:%u, refresh_interval:%u, retry_interval:%u",
			rtr_socket->expire_interval, rtr_socket->refresh_interval, rtr_socket->retry_interval);
	}
	return RTR_SUCCESS;
}